

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

void __thiscall
actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>
          (ActorThread<PingPong> *this,Channel<int> *args)

{
  type local_40 [3];
  Channel<int> local_28;
  Channel<int> *local_18;
  Channel<int> *args_local;
  ActorThread<PingPong> *this_local;
  
  local_18 = args;
  args_local = (Channel<int> *)this;
  Channel<int>::Channel(&local_28,args);
  PingPong::PingPong(&this->super_PingPong,&local_28);
  Channel<int>::~Channel(&local_28);
  local_40[0].this = this;
  std::thread::
  thread<actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>(actorpp::Channel<int>&)::_lambda()_1_,,void>
            (&this->thread,local_40);
  return;
}

Assistant:

ActorThread(Args &&...args)
      : ActorT(std::forward<Args>(args)...), thread([&] { this->run(); }) {}